

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

bool __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::update(raw_quasi_adaptive_huffman_data_model *this)

{
  byte bVar1;
  uint uVar2;
  uint16 *puVar3;
  uint8 *puVar4;
  decoder_tables *pTables;
  undefined8 uVar5;
  long lVar6;
  bool bVar7;
  uint uVar8;
  undefined8 in_RAX;
  undefined8 uStack_20;
  undefined8 local_18;
  uint max_code_size;
  uint total_freq;
  
  uVar8 = this->m_total_count + this->m_update_cycle;
  this->m_total_count = uVar8;
  local_18 = in_RAX;
  while (0x7fff < uVar8) {
    uStack_20 = 0x11ea05;
    rescale(this);
    uVar8 = this->m_total_count;
  }
  if (this->m_use_polar_codes == true) {
    uStack_20 = 0x11ea15;
    uVar8 = get_generate_polar_codes_table_size();
  }
  else {
    uStack_20 = 0x11ea1c;
    uVar8 = get_generate_huffman_codes_table_size();
  }
  lVar6 = -((ulong)uVar8 + 0xf & 0xfffffffffffffff0);
  uVar2 = this->m_total_syms;
  puVar3 = (this->m_sym_freq).m_p;
  puVar4 = (this->m_code_sizes).m_p;
  if (this->m_use_polar_codes == true) {
    *(undefined8 *)((long)&uStack_20 + lVar6) = 0x11ea4c;
    bVar7 = generate_polar_codes
                      ((void *)((long)&local_18 + lVar6),uVar2,puVar3,puVar4,(uint *)&local_18,
                       (uint *)((long)&local_18 + 4));
  }
  else {
    *(undefined8 *)((long)&uStack_20 + lVar6) = 0x11ea5b;
    bVar7 = generate_huffman_codes
                      ((void *)((long)&local_18 + lVar6),uVar2,puVar3,puVar4,(uint *)&local_18,
                       (uint *)((long)&local_18 + 4));
  }
  if ((bVar7 != false) && (local_18._4_4_ == this->m_total_count)) {
    if (0x10 < (uint)local_18) {
      uVar2 = this->m_total_syms;
      puVar4 = (this->m_code_sizes).m_p;
      *(undefined8 *)((long)&uStack_20 + lVar6) = 0x10;
      uVar5 = *(undefined8 *)((long)&uStack_20 + lVar6);
      *(undefined8 *)((long)&uStack_20 + lVar6) = 0x11ea7c;
      bVar7 = prefix_coding::limit_max_code_size(uVar2,puVar4,(uint)uVar5);
      if (!bVar7) {
        return false;
      }
    }
    uVar2 = this->m_total_syms;
    puVar4 = (this->m_code_sizes).m_p;
    if (this->m_encoding == true) {
      puVar3 = (this->m_codes).m_p;
      *(undefined8 *)((long)&uStack_20 + lVar6) = 0x11ea96;
      bVar7 = prefix_coding::generate_codes(uVar2,puVar4,puVar3);
    }
    else {
      pTables = this->m_pDecode_tables;
      bVar1 = this->m_decoder_table_bits;
      *(undefined8 *)((long)&uStack_20 + lVar6) = 0x11eaa5;
      bVar7 = prefix_coding::generate_decoder_tables(uVar2,puVar4,pTables,(uint)bVar1);
    }
    if (bVar7 != false) {
      uVar8 = this->m_update_cycle * 2;
      if (this->m_fast_updating == false) {
        uVar8 = this->m_update_cycle * 5 >> 2;
      }
      if (this->m_max_cycle <= uVar8) {
        uVar8 = this->m_max_cycle;
      }
      this->m_update_cycle = uVar8;
      this->m_symbols_until_update = uVar8;
      return true;
    }
  }
  return false;
}

Assistant:

bool raw_quasi_adaptive_huffman_data_model::update()
   {
      LZHAM_ASSERT(!m_symbols_until_update);
      m_total_count += m_update_cycle;
      LZHAM_ASSERT(m_total_count <= 65535);

      while (m_total_count >= 32768)
         rescale();

      uint table_size = m_use_polar_codes ? get_generate_polar_codes_table_size() : get_generate_huffman_codes_table_size();
      void *pTables = alloca(table_size);

      uint max_code_size, total_freq;
      bool status;
      if (m_use_polar_codes)
         status = generate_polar_codes(pTables, m_total_syms, &m_sym_freq[0], &m_code_sizes[0], max_code_size, total_freq);
      else
         status = generate_huffman_codes(pTables, m_total_syms, &m_sym_freq[0], &m_code_sizes[0], max_code_size, total_freq);
      LZHAM_ASSERT(status);
      LZHAM_ASSERT(total_freq == m_total_count);
      if ((!status) || (total_freq != m_total_count))
         return false;

      if (max_code_size > prefix_coding::cMaxExpectedCodeSize)
      {
         bool status = prefix_coding::limit_max_code_size(m_total_syms, &m_code_sizes[0], prefix_coding::cMaxExpectedCodeSize);
         LZHAM_ASSERT(status);
         if (!status)
            return false;
      }

      if (m_encoding)
         status = prefix_coding::generate_codes(m_total_syms, &m_code_sizes[0], &m_codes[0]);
      else
         status = prefix_coding::generate_decoder_tables(m_total_syms, &m_code_sizes[0], m_pDecode_tables, m_decoder_table_bits);

      LZHAM_ASSERT(status);
      if (!status)
         return false;

      if (m_fast_updating)
         m_update_cycle = 2 * m_update_cycle;
      else
         m_update_cycle = (5 * m_update_cycle) >> 2;

      if (m_update_cycle > m_max_cycle)
         m_update_cycle = m_max_cycle;

      m_symbols_until_update = m_update_cycle;

      return true;
   }